

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_point_query_base.h
# Opt level: O0

void __thiscall
S2ClosestPointQueryBase<S2MinDistance,_int>::FindClosestPointsOptimized
          (S2ClosestPointQueryBase<S2MinDistance,_int> *this)

{
  bool bVar1;
  const_reference pQVar2;
  int local_164;
  bool local_15d;
  int i;
  bool seek;
  S2CellId child;
  priority_queue<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>,_std::less<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
  local_148;
  double local_38;
  S1ChordAngle local_30;
  S1ChordAngle local_28;
  S2MinDistance distance;
  QueueEntry entry;
  S2ClosestPointQueryBase<S2MinDistance,_int> *this_local;
  
  entry.id.id_ = (uint64)this;
  InitQueue(this);
  while( true ) {
    bVar1 = std::
            priority_queue<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>,_std::less<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
            ::empty(&this->queue_);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    pQVar2 = std::
             priority_queue<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>,_std::less<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
             ::top(&this->queue_);
    distance.super_S1ChordAngle.length2_ =
         (S1ChordAngle)(pQVar2->distance).super_S1ChordAngle.length2_;
    entry.distance.super_S1ChordAngle.length2_ = (S1ChordAngle)(pQVar2->id).id_;
    std::
    priority_queue<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>,_std::less<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
    ::pop(&this->queue_);
    local_28 = distance.super_S1ChordAngle.length2_;
    local_30 = distance.super_S1ChordAngle.length2_;
    local_38 = (this->distance_limit_).super_S1ChordAngle.length2_;
    bVar1 = ::operator<(distance.super_S1ChordAngle.length2_,(S1ChordAngle)local_38);
    if (!bVar1) break;
    _i = S2CellId::child_begin((S2CellId *)&entry);
    local_15d = true;
    local_164 = 0;
    while (local_164 < 4) {
      local_15d = ProcessOrEnqueue(this,_i,&this->iter_,local_15d);
      local_164 = local_164 + 1;
      _i = S2CellId::next((S2CellId *)&i);
    }
  }
  std::
  priority_queue<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry,absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry,16ul,std::allocator<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry>>,std::less<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry>>
  ::
  priority_queue<absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry,16ul,std::allocator<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry>>,void>
            ((priority_queue<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry,absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry,16ul,std::allocator<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry>>,std::less<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry>>
              *)&local_148);
  std::
  priority_queue<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>,_std::less<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
  ::operator=(&this->queue_,&local_148);
  std::
  priority_queue<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>,_std::less<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
  ::~priority_queue(&local_148);
  return;
}

Assistant:

void S2ClosestPointQueryBase<Distance, Data>::FindClosestPointsOptimized() {
  InitQueue();
  while (!queue_.empty()) {
    // We need to copy the top entry before removing it, and we need to remove
    // it before adding any new entries to the queue.
    QueueEntry entry = queue_.top();
    queue_.pop();
    // Work around weird parse error in gcc 4.9 by using a local variable for
    // entry.distance.
    Distance distance = entry.distance;
    if (!(distance < distance_limit_)) {
      queue_ = CellQueue();  // Clear any remaining entries.
      break;
    }
    S2CellId child = entry.id.child_begin();
    // We already know that it has too many points, so process its children.
    // Each child may either be processed directly or enqueued again.  The
    // loop is optimized so that we don't seek unnecessarily.
    bool seek = true;
    for (int i = 0; i < 4; ++i, child = child.next()) {
      seek = ProcessOrEnqueue(child, &iter_, seek);
    }
  }
}